

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::AddVars(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *this,VarBndVec *lbs,VarBndVec *ubs,VarTypeVec *types)

{
  ValueNode *this_00;
  NodeRange NVar1;
  
  FlatModel<mp::DefaultFlatModelParams>::AddVars__basic
            (&this->super_FlatModel<mp::DefaultFlatModelParams>,lbs,ubs,types);
  this_00 = pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::operator()
                      (&(this->value_presolver_).super_ValuePresolverImpl.dest_.vars_);
  NVar1 = pre::ValueNode::Add(this_00,(int)((ulong)((long)(lbs->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(lbs->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3))
  ;
  NVar1 = AutoLink(this,NVar1);
  return NVar1;
}

Assistant:

pre::NodeRange AddVars(const typename BaseFlatModel::VarBndVec& lbs,
               const typename BaseFlatModel::VarBndVec& ubs,
               const typename BaseFlatModel::VarTypeVec& types) {
    assert(0==BaseFlatModel::num_vars());                     // allow this only once
    BaseFlatModel::AddVars__basic(lbs, ubs, types);
    return AutoLink( GetVarValueNode().Add( lbs.size() ) );
  }